

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O1

void __thiscall llvm::DWARFDebugLine::Row::reset(Row *this,bool DefaultIsStmt)

{
  (this->Address).Address = 0;
  (this->Address).SectionIndex = 0xffffffffffffffff;
  this->Line = 1;
  this->Column = 0;
  this->File = 1;
  this->Isa = '\0';
  this->Discriminator = 0;
  this->field_0x1d = this->field_0x1d & 0xe0 | DefaultIsStmt;
  return;
}

Assistant:

void DWARFDebugLine::Row::reset(bool DefaultIsStmt) {
  Address.Address = 0;
  Address.SectionIndex = object::SectionedAddress::UndefSection;
  Line = 1;
  Column = 0;
  File = 1;
  Isa = 0;
  Discriminator = 0;
  IsStmt = DefaultIsStmt;
  BasicBlock = false;
  EndSequence = false;
  PrologueEnd = false;
  EpilogueBegin = false;
}